

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandListVkImpl.hpp
# Opt level: O0

void __thiscall Diligent::CommandListVkImpl::~CommandListVkImpl(CommandListVkImpl *this)

{
  void *in_RSI;
  CommandListVkImpl *this_local;
  
  ~CommandListVkImpl(this);
  RefCountedObject<Diligent::ICommandList>::operator_delete
            ((RefCountedObject<Diligent::ICommandList> *)this,in_RSI);
  return;
}

Assistant:

~CommandListVkImpl()
    {
        VERIFY(m_vkCmdBuff == VK_NULL_HANDLE && !m_pDeferredCtx, "Destroying command list that was never executed");
    }